

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

_glist * template_findcanvas(t_template *template)

{
  _glist *p_Var1;
  
  if (template == (t_template *)0x0) {
    p_Var1 = (_glist *)0x0;
    bug("template_findcanvas");
  }
  else if (template->t_list == (_gtemplate *)0x0) {
    p_Var1 = (_glist *)0x0;
  }
  else {
    p_Var1 = template->t_list->x_owner;
  }
  return p_Var1;
}

Assistant:

t_canvas *template_findcanvas(t_template *template)
{
    t_gtemplate *gt;
    if (!template)
    {
        bug("template_findcanvas");
        return (0);
    }
    if (!(gt = template->t_list))
        return (0);
    return (gt->x_owner);
    /* return ((t_canvas *)pd_findbyclass(template->t_sym, canvas_class)); */
}